

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeJacobian
          (ChElementTetraCorot_10 *this,ChMatrixDynamic<> *Jacobian,double zeta1,double zeta2,
          double zeta3,double zeta4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long lVar37;
  long lVar38;
  pointer psVar39;
  element_type *peVar40;
  element_type *peVar41;
  element_type *peVar42;
  element_type *peVar43;
  double *pdVar44;
  element_type *peVar45;
  element_type *peVar46;
  ActualDstType actualDst;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  assign_op<double,_double> local_49;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_28;
  
  local_28.m_rows.m_value =
       (Jacobian->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows
  ;
  local_28.m_cols.m_value =
       (Jacobian->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
  ;
  local_28.m_functor.m_other = 1.0;
  local_48 = zeta2;
  local_40 = zeta1;
  local_38 = zeta3;
  local_30 = zeta4;
  if ((local_28.m_cols.m_value | local_28.m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            (Jacobian,&local_28,&local_49);
  lVar37 = (Jacobian->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
           m_rows;
  if ((1 < lVar37) &&
     (lVar38 = (Jacobian->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
               m_storage.m_cols, 0 < lVar38)) {
    psVar39 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar40 = (psVar39->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    peVar41 = psVar39[4].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_40;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)((long)&peVar40->super_ChNodeFEAbase + 0x20);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_48 * *(double *)((long)&peVar41->super_ChNodeFEAbase + 0x20);
    auVar1 = vfmadd231sd_fma(auVar47,auVar61,auVar1);
    peVar42 = psVar39[6].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_38;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)((long)&peVar42->super_ChNodeFEAbase + 0x20);
    auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar2);
    peVar43 = psVar39[7].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_30;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)((long)&peVar43->super_ChNodeFEAbase + 0x20);
    auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar3);
    pdVar44 = (Jacobian->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
              .m_data;
    pdVar44[lVar38] = auVar1._0_8_ * 4.0;
    if (lVar37 != 2) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)&peVar40->field_0x28;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_48 * *(double *)&peVar41->field_0x28;
      auVar1 = vfmadd231sd_fma(auVar48,auVar61,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)&peVar42->field_0x28;
      auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)&peVar43->field_0x28;
      auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar6);
      pdVar44[lVar38 * 2] = auVar1._0_8_ * 4.0;
      if (3 < lVar37) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)&peVar40->field_0x30;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = local_48 * *(double *)&peVar41->field_0x30;
        auVar1 = vfmadd231sd_fma(auVar49,auVar61,auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)&peVar42->field_0x30;
        auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)&peVar43->field_0x30;
        auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar9);
        pdVar44[lVar38 * 3] = auVar1._0_8_ * 4.0;
        if (lVar38 != 1) {
          peVar40 = psVar39[8].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          peVar45 = psVar39[1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          peVar46 = psVar39[5].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((long)&peVar41->super_ChNodeFEAbase + 0x20);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_48 * *(double *)((long)&peVar45->super_ChNodeFEAbase + 0x20);
          auVar1 = vfmadd231sd_fma(auVar50,auVar61,auVar10);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)((long)&peVar46->super_ChNodeFEAbase + 0x20);
          auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar11);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)((long)&peVar40->super_ChNodeFEAbase + 0x20);
          auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar12);
          pdVar44[lVar38 + 1] = auVar1._0_8_ * 4.0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)&peVar41->field_0x28;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_48 * *(double *)&peVar45->field_0x28;
          auVar1 = vfmadd231sd_fma(auVar51,auVar61,auVar13);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)&peVar46->field_0x28;
          auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar14);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = *(ulong *)&peVar40->field_0x28;
          auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar15);
          pdVar44[lVar38 * 2 + 1] = auVar1._0_8_ * 4.0;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)&peVar41->field_0x30;
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_48 * *(double *)&peVar45->field_0x30;
          auVar1 = vfmadd231sd_fma(auVar52,auVar61,auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)&peVar46->field_0x30;
          auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar17);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *(ulong *)&peVar40->field_0x30;
          auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar18);
          pdVar44[lVar38 * 3 + 1] = auVar1._0_8_ * 4.0;
          if (2 < lVar38) {
            peVar41 = psVar39[2].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            peVar45 = psVar39[9].
                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = *(ulong *)((long)&peVar42->super_ChNodeFEAbase + 0x20);
            auVar53._8_8_ = 0;
            auVar53._0_8_ = local_48 * *(double *)((long)&peVar46->super_ChNodeFEAbase + 0x20);
            auVar1 = vfmadd231sd_fma(auVar53,auVar61,auVar19);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = *(ulong *)((long)&peVar41->super_ChNodeFEAbase + 0x20);
            auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar20);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = *(ulong *)((long)&peVar45->super_ChNodeFEAbase + 0x20);
            auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar21);
            pdVar44[lVar38 + 2] = auVar1._0_8_ * 4.0;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = *(ulong *)&peVar42->field_0x28;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = local_48 * *(double *)&peVar46->field_0x28;
            auVar1 = vfmadd231sd_fma(auVar54,auVar61,auVar22);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = *(ulong *)&peVar41->field_0x28;
            auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar23);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = *(ulong *)&peVar45->field_0x28;
            auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar24);
            pdVar44[lVar38 * 2 + 2] = auVar1._0_8_ * 4.0;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = *(ulong *)&peVar42->field_0x30;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = local_48 * *(double *)&peVar46->field_0x30;
            auVar1 = vfmadd231sd_fma(auVar55,auVar61,auVar25);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(ulong *)&peVar41->field_0x30;
            auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar26);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = *(ulong *)&peVar45->field_0x30;
            auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar27);
            pdVar44[lVar38 * 3 + 2] = auVar1._0_8_ * 4.0;
            if (lVar38 != 3) {
              peVar41 = psVar39[3].
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              auVar28._8_8_ = 0;
              auVar28._0_8_ = *(ulong *)((long)&peVar43->super_ChNodeFEAbase + 0x20);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_48 * *(double *)((long)&peVar40->super_ChNodeFEAbase + 0x20);
              auVar1 = vfmadd231sd_fma(auVar56,auVar61,auVar28);
              auVar29._8_8_ = 0;
              auVar29._0_8_ = *(ulong *)((long)&peVar45->super_ChNodeFEAbase + 0x20);
              auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar29);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)((long)&peVar41->super_ChNodeFEAbase + 0x20);
              auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar30);
              pdVar44[lVar38 + 3] = auVar1._0_8_ * 4.0;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)&peVar43->field_0x28;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = local_48 * *(double *)&peVar40->field_0x28;
              auVar1 = vfmadd231sd_fma(auVar57,auVar61,auVar31);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)&peVar45->field_0x28;
              auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar32);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)&peVar41->field_0x28;
              auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar33);
              pdVar44[lVar38 * 2 + 3] = auVar1._0_8_ * 4.0;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)&peVar43->field_0x30;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = local_48 * *(double *)&peVar40->field_0x30;
              auVar1 = vfmadd231sd_fma(auVar58,auVar61,auVar34);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = *(ulong *)&peVar45->field_0x30;
              auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar35);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)&peVar41->field_0x30;
              auVar1 = vfmadd231sd_fma(auVar1,auVar59,auVar36);
              pdVar44[lVar38 * 3 + 3] = auVar1._0_8_ * 4.0;
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_10::ComputeJacobian(ChMatrixDynamic<>& Jacobian,
                                             double zeta1,
                                             double zeta2,
                                             double zeta3,
                                             double zeta4) {
    Jacobian.setConstant(1);

    Jacobian(1, 0) = 4 * (nodes[0]->pos.x() * (zeta1 - 1 / 4) + nodes[4]->pos.x() * zeta2 + nodes[6]->pos.x() * zeta3 +
                          nodes[7]->pos.x() * zeta4);
    Jacobian(2, 0) = 4 * (nodes[0]->pos.y() * (zeta1 - 1 / 4) + nodes[4]->pos.y() * zeta2 + nodes[6]->pos.y() * zeta3 +
                          nodes[7]->pos.y() * zeta4);
    Jacobian(3, 0) = 4 * (nodes[0]->pos.z() * (zeta1 - 1 / 4) + nodes[4]->pos.z() * zeta2 + nodes[6]->pos.z() * zeta3 +
                          nodes[7]->pos.z() * zeta4);
    Jacobian(1, 1) = 4 * (nodes[4]->pos.x() * zeta1 + nodes[1]->pos.x() * (zeta2 - 1 / 4) + nodes[5]->pos.x() * zeta3 +
                          nodes[8]->pos.x() * zeta4);
    Jacobian(2, 1) = 4 * (nodes[4]->pos.y() * zeta1 + nodes[1]->pos.y() * (zeta2 - 1 / 4) + nodes[5]->pos.y() * zeta3 +
                          nodes[8]->pos.y() * zeta4);
    Jacobian(3, 1) = 4 * (nodes[4]->pos.z() * zeta1 + nodes[1]->pos.z() * (zeta2 - 1 / 4) + nodes[5]->pos.z() * zeta3 +
                          nodes[8]->pos.z() * zeta4);
    Jacobian(1, 2) = 4 * (nodes[6]->pos.x() * zeta1 + nodes[5]->pos.x() * zeta2 + nodes[2]->pos.x() * (zeta3 - 1 / 4) +
                          nodes[9]->pos.x() * zeta4);
    Jacobian(2, 2) = 4 * (nodes[6]->pos.y() * zeta1 + nodes[5]->pos.y() * zeta2 + nodes[2]->pos.y() * (zeta3 - 1 / 4) +
                          nodes[9]->pos.y() * zeta4);
    Jacobian(3, 2) = 4 * (nodes[6]->pos.z() * zeta1 + nodes[5]->pos.z() * zeta2 + nodes[2]->pos.z() * (zeta3 - 1 / 4) +
                          nodes[9]->pos.z() * zeta4);
    Jacobian(1, 3) = 4 * (nodes[7]->pos.x() * zeta1 + nodes[8]->pos.x() * zeta2 + nodes[9]->pos.x() * zeta3 +
                          nodes[3]->pos.x() * (zeta4 - 1 / 4));
    Jacobian(2, 3) = 4 * (nodes[7]->pos.y() * zeta1 + nodes[8]->pos.y() * zeta2 + nodes[9]->pos.y() * zeta3 +
                          nodes[3]->pos.y() * (zeta4 - 1 / 4));
    Jacobian(3, 3) = 4 * (nodes[7]->pos.z() * zeta1 + nodes[8]->pos.z() * zeta2 + nodes[9]->pos.z() * zeta3 +
                          nodes[3]->pos.z() * (zeta4 - 1 / 4));
}